

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
s2textformat::MakeLaxPolygonOrDie(string_view str)

{
  string_view str_00;
  bool bVar1;
  ostream *poVar2;
  absl *this;
  size_type sVar3;
  char *in_RDX;
  __uniq_ptr_data<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>,_true,_true> this_00;
  string_view piece;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [13];
  ostream *local_38;
  char *pcStack_30;
  undefined1 local_21;
  ostream *poStack_20;
  string_view str_local;
  unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> *lax_polygon;
  
  poStack_20 = (ostream *)str.length_;
  this_00.super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>._M_t.
  super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
  super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl =
       (__uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>)str.ptr_;
  local_21 = 0;
  str_local.ptr_ = in_RDX;
  str_local.length_ =
       (size_type)
       this_00.super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>.
       _M_t.super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
       super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl;
  std::unique_ptr<S2LaxPolygonShape,std::default_delete<S2LaxPolygonShape>>::
  unique_ptr<std::default_delete<S2LaxPolygonShape>,void>
            ((unique_ptr<S2LaxPolygonShape,std::default_delete<S2LaxPolygonShape>> *)
             this_00.
             super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>._M_t.
             super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
             super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl);
  local_38 = poStack_20;
  pcStack_30 = str_local.ptr_;
  str_00.length_ = (size_type)str_local.ptr_;
  str_00.ptr_ = (char *)poStack_20;
  bVar1 = MakeLaxPolygon(str_00,(unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
                                 *)this_00.
                                   super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>
                                   .super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return (__uniq_ptr_data<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>,_true,_true>)
           (tuple<S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>)
           this_00.super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
           ._M_t.
           super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
           super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl;
  }
  sVar3 = 3;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x119,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_58);
  poVar2 = std::operator<<(poVar2,"Check failed: MakeLaxPolygon(str, &lax_polygon) ");
  this = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  piece.ptr_ = str_local.ptr_;
  poVar2 = absl::operator<<(this,poStack_20,piece);
  poVar2 = std::operator<<(poVar2,"\"");
  S2LogMessageVoidify::operator&(local_45,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
}

Assistant:

unique_ptr<S2LaxPolygonShape> MakeLaxPolygonOrDie(string_view str) {
  unique_ptr<S2LaxPolygonShape> lax_polygon;
  S2_CHECK(MakeLaxPolygon(str, &lax_polygon)) << ": str == \"" << str << "\"";
  return lax_polygon;
}